

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteStandard<unsigned_short,unsigned_short,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  Vector VVar1;
  ushort *puVar2;
  ushort *puVar3;
  unsigned_short *puVar4;
  unsigned_short *puVar5;
  optional_idx sel_vector;
  idx_t iVar6;
  Vector *vector;
  SelectionVector *pSVar7;
  SelectionVector *pSVar8;
  VectorType VVar9;
  optional_idx dict_size;
  unsigned_short *local_70;
  ValidityMask local_68;
  
  VVar1 = *input;
  VVar9 = (VectorType)result;
  if (VVar1 == (Vector)0x0) {
    duckdb::Vector::SetVectorType(VVar9);
    puVar4 = *(unsigned_short **)(result + 0x20);
    puVar5 = *(unsigned_short **)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<unsigned_short,unsigned_short,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
              (puVar5,puVar4,count,(ValidityMask *)(input + 0x28),(ValidityMask *)(result + 0x28),
               dataptr,adds_nulls);
  }
  else {
    if (VVar1 == (Vector)0x3) {
      if ((((errors == CANNOT_ERROR) &&
           (dict_size = DictionaryVector::DictionarySize(input),
           dict_size.index != 0xffffffffffffffff)) &&
          (iVar6 = optional_idx::GetIndex(&dict_size), iVar6 * 2 <= count)) &&
         (vector = DictionaryVector::Child(input), *vector == (Vector)0x0)) {
        puVar4 = *(unsigned_short **)(result + 0x20);
        puVar5 = *(unsigned_short **)(vector + 0x20);
        iVar6 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        ExecuteFlat<unsigned_short,unsigned_short,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
                  (puVar5,puVar4,iVar6,(ValidityMask *)(vector + 0x28),
                   (ValidityMask *)(result + 0x28),dataptr,adds_nulls);
        pSVar7 = DictionaryVector::SelVector(input);
        pSVar8 = (SelectionVector *)optional_idx::GetIndex(&dict_size);
        duckdb::Vector::Dictionary(result,(ulong)result,pSVar8,(ulong)pSVar7);
        return;
      }
    }
    else if (VVar1 == (Vector)0x2) {
      duckdb::Vector::SetVectorType(VVar9);
      puVar2 = *(ushort **)(result + 0x20);
      puVar3 = *(ushort **)(input + 0x20);
      if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
        duckdb::ConstantVector::SetNull(result,true);
        return;
      }
      duckdb::ConstantVector::SetNull(result,false);
      *puVar2 = ~*puVar3;
      return;
    }
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::SetVectorType(VVar9);
    sel_vector = dict_size;
    puVar4 = *(unsigned_short **)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    ExecuteLoop<unsigned_short,unsigned_short,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
              (local_70,puVar4,count,(SelectionVector *)sel_vector.index,&local_68,
               (ValidityMask *)(result + 0x28),dataptr,adds_nulls);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}